

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec
          (GpuCounterDescriptor_GpuCounterSpec *this,GpuCounterDescriptor_GpuCounterSpec *param_1)

{
  double dVar1;
  pointer pGVar2;
  pointer pGVar3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_GpuCounterSpec_00406f48;
  this->counter_id_ = param_1->counter_id_;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  ::std::__cxx11::string::string((string *)&this->description_,(string *)&param_1->description_);
  dVar1 = param_1->double_peak_value_;
  this->int_peak_value_ = param_1->int_peak_value_;
  this->double_peak_value_ = dVar1;
  pGVar2 = (param_1->numerator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->numerator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->numerator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar2 = (param_1->denominator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->denominator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->denominator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->select_by_default_ = param_1->select_by_default_;
  pGVar3 = (param_1->groups_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->groups_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar3;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->groups_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec(GpuCounterDescriptor_GpuCounterSpec&&) noexcept = default;